

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_tile.c
# Opt level: O1

int TIFFCheckTile(TIFF *tif,uint32_t x,uint32_t y,uint32_t z,uint16_t s)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char *fmt;
  char *module;
  
  uVar2 = (tif->tif_dir).td_imagewidth;
  if (x < uVar2) {
    uVar2 = (tif->tif_dir).td_imagelength;
    if (y < uVar2) {
      uVar2 = (tif->tif_dir).td_imagedepth;
      if (z < uVar2) {
        if ((tif->tif_dir).td_planarconfig != 2) {
          return 1;
        }
        uVar1 = (tif->tif_dir).td_samplesperpixel;
        if (s < uVar1) {
          return 1;
        }
        module = tif->tif_name;
        uVar4 = (ulong)s;
        uVar3 = (ulong)uVar1 - 1;
        fmt = "%lu: Sample out of range, max %lu";
      }
      else {
        module = tif->tif_name;
        uVar4 = (ulong)z;
        uVar3 = (ulong)(uVar2 - 1);
        fmt = "%lu: Depth out of range, max %lu";
      }
    }
    else {
      module = tif->tif_name;
      uVar4 = (ulong)y;
      uVar3 = (ulong)(uVar2 - 1);
      fmt = "%lu: Row out of range, max %lu";
    }
  }
  else {
    module = tif->tif_name;
    uVar4 = (ulong)x;
    uVar3 = (ulong)(uVar2 - 1);
    fmt = "%lu: Col out of range, max %lu";
  }
  TIFFErrorExtR(tif,module,fmt,uVar4,uVar3);
  return 0;
}

Assistant:

int TIFFCheckTile(TIFF *tif, uint32_t x, uint32_t y, uint32_t z, uint16_t s)
{
    TIFFDirectory *td = &tif->tif_dir;

    if (x >= td->td_imagewidth)
    {
        TIFFErrorExtR(tif, tif->tif_name, "%lu: Col out of range, max %lu",
                      (unsigned long)x, (unsigned long)(td->td_imagewidth - 1));
        return (0);
    }
    if (y >= td->td_imagelength)
    {
        TIFFErrorExtR(tif, tif->tif_name, "%lu: Row out of range, max %lu",
                      (unsigned long)y,
                      (unsigned long)(td->td_imagelength - 1));
        return (0);
    }
    if (z >= td->td_imagedepth)
    {
        TIFFErrorExtR(tif, tif->tif_name, "%lu: Depth out of range, max %lu",
                      (unsigned long)z, (unsigned long)(td->td_imagedepth - 1));
        return (0);
    }
    if (td->td_planarconfig == PLANARCONFIG_SEPARATE &&
        s >= td->td_samplesperpixel)
    {
        TIFFErrorExtR(tif, tif->tif_name, "%lu: Sample out of range, max %lu",
                      (unsigned long)s,
                      (unsigned long)(td->td_samplesperpixel - 1));
        return (0);
    }
    return (1);
}